

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_storage.hpp
# Opt level: O1

void __thiscall libtorrent::torrent_info::remap_files(torrent_info *this,file_storage *f)

{
  _Head_base<0UL,_const_libtorrent::file_storage_*,_false> _Var1;
  
  if ((this->m_files).m_total_size == f->m_total_size) {
    copy_on_write(this);
    file_storage::operator=(&this->m_files,f);
    _Var1._M_head_impl =
         (this->m_orig_files).m_ptr._M_t.
         super___uniq_ptr_impl<const_libtorrent::file_storage,_std::default_delete<const_libtorrent::file_storage>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_libtorrent::file_storage_*,_std::default_delete<const_libtorrent::file_storage>_>
         .super__Head_base<0UL,_const_libtorrent::file_storage_*,_false>._M_head_impl;
    (this->m_files).m_num_pieces = (_Var1._M_head_impl)->m_num_pieces;
    (this->m_files).m_piece_length = (_Var1._M_head_impl)->m_piece_length;
  }
  return;
}

Assistant:

std::int64_t total_size() const { return m_total_size; }